

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
kratos::Generator::handle_name_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,bool ignore_top)

{
  ostream *poVar1;
  string *psVar2;
  Generator *this_00;
  string *psVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InternalException *this_01;
  undefined7 in_register_00000011;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long lVar5;
  long lVar6;
  optional<unsigned_long> oVar7;
  basic_string_view<char> bVar8;
  string_view format_str;
  format_args args;
  undefined1 local_230 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> label;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string local_68;
  undefined4 local_40;
  allocator<char> local_39;
  string *local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000011,ignore_top);
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->instance_name);
  n.field_2._8_8_ = 0;
  do {
    if (this == (Generator *)0x0) {
      lVar5 = (ulong)(byte)local_40 * 0x20 + n.field_2._8_8_;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,".",&local_39);
      std::__cxx11::stringstream::stringstream((stringstream *)local_230);
      poVar1 = (ostream *)
               ((long)&label.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 8);
      for (lVar6 = 0; psVar2 = (string *)(lVar5 + lVar6), psVar2 != (string *)0x0;
          lVar6 = lVar6 + 0x20) {
        if (lVar6 != 0) {
          std::operator<<(poVar1,(string *)local_a8);
        }
        std::operator<<(poVar1,psVar2);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
      psVar3 = local_38;
      std::__cxx11::string::operator=((string *)local_38,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&n.field_2 + 8));
      return psVar3;
    }
    if ((this->parent_generator_ == (Generator *)0x0) ||
       (this->instantiation_stmt_ == (ModuleInstantiationStmt *)0x0)) {
LAB_0017a372:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_emplace_aux<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (n.field_2._M_local_buf + 8),(const_iterator)n.field_2._8_8_,&this->instance_name);
    }
    else {
      iVar4 = (*(this->instantiation_stmt_->super_Stmt).super_IRNode._vptr_IRNode[4])();
      if (*(int *)(CONCAT44(extraout_var,iVar4) + 0x48) != 2) goto LAB_0017a372;
      iVar4 = (*(this->instantiation_stmt_->super_Stmt).super_IRNode._vptr_IRNode[4])();
      this_00 = this->parent_generator_;
      std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 &(((ForStmt *)CONCAT44(extraout_var_00,iVar4))->loop_body_).
                  super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>);
      get_block_name_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_230,this_00,(Stmt *)local_68._M_dataplus._M_p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->instantiation_stmt_->super_Stmt).
                  super_enable_shared_from_this<kratos::Stmt>);
      oVar7 = ForStmt::genvar_index
                        ((ForStmt *)CONCAT44(extraout_var_00,iVar4),
                         (shared_ptr<kratos::Stmt> *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
      if ((label.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._24_1_ != '\x01') ||
         (((undefined1  [16])
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0)) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"Invalid state of genvar instance array",
                   (allocator<char> *)local_a8);
        InternalException::InternalException(this_01,&local_68);
        __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_68._M_dataplus._M_p = (this->instance_name)._M_dataplus._M_p;
      local_68._M_string_length = (this->instance_name)._M_string_length;
      local_68.field_2._M_allocated_capacity =
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      bVar8 = fmt::v7::to_string_view<char,_0>("{0}[{1}]");
      format_str.data_ = (char *)bVar8.size_;
      format_str.size_ = 0x4d;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_((string *)local_a8,(detail *)bVar8.data_,format_str,args);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_emplace_aux<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (n.field_2._M_local_buf + 8),(const_iterator)n.field_2._8_8_,(string *)local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_emplace_aux<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (n.field_2._M_local_buf + 8),(const_iterator)n.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
      std::__cxx11::string::~string((string *)local_a8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_230);
    }
    this = this->parent_generator_;
  } while( true );
}

Assistant:

std::string Generator::handle_name(bool ignore_top) const {
    // this is used to identify the generator from the top level
    std::string result = instance_name;
    auto const *current = this;
    std::vector<std::string> values;
    while (current != nullptr) {
        // need to check if we are in a gen block
        if (current->parent_generator_ && current->instantiation_stmt_ &&
            current->instantiation_stmt_->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            // need to find out the label
            // need two parents since the previous parent is a stmt block
            auto *for_ = reinterpret_cast<ForStmt *>(current->instantiation_stmt_->parent());
            auto label = current->parent_generator_->get_block_name(for_->get_loop_body().get());
            // need to find out the index
            auto index = for_->genvar_index(current->instantiation_stmt_->shared_from_this());
            if (!label || !index) {
                throw InternalException("Invalid state of genvar instance array");
            }

            auto n = ::format("{0}[{1}]", current->instance_name, *index);
            values.emplace(values.begin(), n);
            values.emplace(values.begin(), *label);
        } else {
            values.emplace(values.begin(), current->instance_name);
        }

        current = current->parent_generator_;
    }
    auto starting = ignore_top ? 1u : 0u;
    result = string::join(values.begin() + starting, values.end(), ".");

    return result;
}